

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_pointerLikeType_load(sysbvm_context_t *context,sysbvm_tuple_t pointerLikeValue)

{
  uint uVar1;
  sysbvm_tuple_t *psVar2;
  _Bool _Var3;
  ulong uVar4;
  sysbvm_tuple_t sVar5;
  undefined8 uVar6;
  ulong immediateTypeTag;
  size_t typeTag;
  undefined8 local_60;
  sysbvm_tuple_t *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  if (pointerLikeValue == 0) {
    sysbvm_error("Accessing null pointer.");
  }
  uVar4 = (ulong)((uint)pointerLikeValue & 0xf);
  if (uVar4 == 0xf) {
    sVar5 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,pointerLikeValue >> 4);
  }
  else if (uVar4 == 0) {
    sVar5 = *(sysbvm_tuple_t *)pointerLikeValue;
  }
  else {
    sVar5 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
  }
  if (((sVar5 & 0xf) == 0 && sVar5 != 0) && ((*(byte *)(sVar5 + 8) & 0x80) == 0)) {
    uVar4 = *(ulong *)(sVar5 + 0x70);
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      uVar4 = (long)uVar4 >> 4;
    }
    else {
      uVar4 = *(ulong *)(uVar4 + 0x10);
    }
    if ((uVar4 & 0xe00) != 0) {
      uVar4 = pointerLikeValue & 0xf;
      if ((uVar4 != 0 || pointerLikeValue == 0) ||
         (uVar1 = *(uint *)(pointerLikeValue + 0xc), uVar1 < 8)) {
        sysbvm_error("Expected a pointer like value with at least single slot.");
      }
      psVar2 = *(sysbvm_tuple_t **)(pointerLikeValue + 0x10);
      if (uVar1 < 0x10) {
        uVar6 = 0xc;
        local_60 = 0;
      }
      else {
        local_60 = *(undefined8 *)(pointerLikeValue + 0x18);
        if ((uVar1 & 0xfffffff8) == 0x10) {
          uVar6 = 0xc;
        }
        else {
          uVar6 = *(undefined8 *)(pointerLikeValue + 0x20);
        }
      }
      immediateTypeTag = (ulong)psVar2 & 0xf;
      if (immediateTypeTag == 0 && psVar2 != (sysbvm_tuple_t *)0x0) {
        sVar5 = *psVar2;
      }
      else if ((int)immediateTypeTag == 0xf) {
        sVar5 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar2 >> 4);
      }
      else {
        sVar5 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
      }
      if (sVar5 == (context->roots).valueBoxType) {
        return psVar2[2];
      }
      if (uVar4 != 0 || pointerLikeValue == 0) {
        if ((int)uVar4 == 0xf) {
          sVar5 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,pointerLikeValue >> 4);
        }
        else {
          sVar5 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
        }
      }
      else {
        sVar5 = *(sysbvm_tuple_t *)pointerLikeValue;
      }
      local_40 = *(undefined8 *)(sVar5 + 0xf8);
      local_50 = local_60;
      local_58 = psVar2;
      local_48 = uVar6;
      sVar5 = sysbvm_tuple_send(context,(context->roots).loadFromAtOffsetWithTypeSelector,4,
                                (sysbvm_tuple_t *)&local_58,0);
      return sVar5;
    }
  }
  _Var3 = sysbvm_tuple_isKindOf(context,sVar5,(context->roots).valueType);
  if (_Var3) {
    return pointerLikeValue;
  }
  sysbvm_error("Expected a pointer like value.");
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_pointerLikeType_load(sysbvm_context_t *context, sysbvm_tuple_t pointerLikeValue)
{
    if(!pointerLikeValue)
        sysbvm_error("Accessing null pointer.");
    sysbvm_tuple_t valueType = sysbvm_tuple_getType(context, pointerLikeValue);
    if(!sysbvm_type_isPointerLikeType(valueType))
    {
        // HACK: Allow treating the value types as pointers to themselves.
        if(sysbvm_tuple_isKindOf(context, valueType, context->roots.valueType))
            return pointerLikeValue;

        sysbvm_error("Expected a pointer like value.");
    }

    size_t slotCount = sysbvm_tuple_getSizeInSlots(pointerLikeValue);
    if(slotCount == 0)
        sysbvm_error("Expected a pointer like value with at least single slot.");

    sysbvm_object_tuple_t *pointerObject = (sysbvm_object_tuple_t*)pointerLikeValue;
    sysbvm_tuple_t storage = pointerObject->pointers[0];
    sysbvm_tuple_t base = SYSBVM_NULL_TUPLE;
    intptr_t offset = sysbvm_tuple_intptr_encode(context, 0);
    if(slotCount >= 2)
    {
        base = pointerObject->pointers[1];
        if(slotCount >= 3)
            offset = pointerObject->pointers[2];
    }

    if(sysbvm_tuple_getType(context, storage) == context->roots.valueBoxType)
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(storage)->pointers[0];

    sysbvm_pointerLikeType_t *pointerLikeType = (sysbvm_pointerLikeType_t*)sysbvm_tuple_getType(context, pointerLikeValue);
    return sysbvm_tuple_send3(context, context->roots.loadFromAtOffsetWithTypeSelector, storage, base, offset, pointerLikeType->baseType);
}